

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  rc_data *__last;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  int iVar2;
  int selected;
  int *piVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  bool bVar5;
  long lVar6;
  rc_data *__first;
  rc_data *__last_00;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_68;
  _Head_base<0UL,_int_*,_false> local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  piVar3 = (first->current)._M_current;
  if (piVar3 == (last->current)._M_current) {
    bVar5 = false;
  }
  else {
    local_54 = theta;
    bVar5 = false;
    do {
      k = piVar3[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_68,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_60._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar6 = *(long *)(this + 0x50);
        _Var4._M_head_impl = local_60._M_head_impl;
        do {
          iVar2 = *_Var4._M_head_impl;
          _Var4._M_head_impl = _Var4._M_head_impl + 8;
          *(longdouble *)(lVar6 + (long)iVar2 * 0x10) =
               *(longdouble *)(lVar6 + (long)iVar2 * 0x10) * local_54;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var4._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      iVar2 = solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(row_iterator)local_60._M_head_impl,
                         (row_iterator)
                         local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (1 < iVar2) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x58);
        lVar6 = (long)iVar2;
        __last = __first + lVar6;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__last,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__last);
        lVar6 = lVar6 * 0x20 + -0x20;
        __last_00 = __first;
        do {
          __last_00 = __last_00 + 1;
          if ((__first->value != __last_00->value) || (NAN(__first->value) || NAN(__last_00->value))
             ) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last_00,__g);
            __first = __last_00;
          }
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      selected = solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                 ::select_variables((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                                     *)this,iVar2,*(int *)(*(long *)(this + 0x60) + (long)k * 8),
                                    *(int *)(*(long *)(this + 0x60) + 4 + (long)k * 8));
      bVar1 = affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,x,(row_value *)local_60._M_head_impl,k,selected,iVar2,local_48,
                         local_3c);
      bVar5 = (bool)(bVar5 | bVar1);
      piVar3 = (first->current)._M_current + -1;
      (first->current)._M_current = piVar3;
    } while (piVar3 != (last->current)._M_current);
  }
  return bVar5;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }